

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::InsertionOrderIndex::insertImpl(InsertionOrderIndex *this,size_t pos)

{
  long lVar1;
  undefined4 uVar2;
  ulong in_RDX;
  Maybe<unsigned_long> MVar3;
  
  if (*(uint *)pos <= in_RDX) {
    reserve((InsertionOrderIndex *)pos,in_RDX + 1);
  }
  lVar1 = *(long *)(pos + 8);
  *(undefined4 *)(lVar1 + 0xc + in_RDX * 8) = *(undefined4 *)(lVar1 + 4);
  *(undefined4 *)(lVar1 + 8 + in_RDX * 8) = 0;
  uVar2 = (undefined4)(in_RDX + 1);
  *(undefined4 *)(lVar1 + (ulong)*(uint *)(lVar1 + 4) * 8) = uVar2;
  *(undefined4 *)(lVar1 + 4) = uVar2;
  *(undefined1 *)&this->capacity = 0;
  MVar3.ptr.field_1.value = in_RDX + 1;
  MVar3.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar3.ptr;
}

Assistant:

kj::Maybe<size_t> InsertionOrderIndex::insertImpl(size_t pos) {
  if (pos >= capacity) {
    reserve(pos + 1);
  }

  links[pos + 1].prev = links[0].prev;
  links[pos + 1].next = 0;
  links[links[0].prev].next = pos + 1;
  links[0].prev = pos + 1;

  return nullptr;
}